

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::AtomicCompSwapCase::iterate(AtomicCompSwapCase *this)

{
  RenderContext *renderContext;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ostringstream *poVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  ChannelType CVar5;
  AtomicOperationCaseType AVar6;
  AtomicOperationCaseType AVar7;
  Functional *pFVar8;
  TestLog *pTVar9;
  bool bVar10;
  uint uVar11;
  ChannelType CVar12;
  int i_1;
  int iVar13;
  deUint32 dVar14;
  ContextType type;
  GLSLVersion version;
  TextureType TVar15;
  undefined4 extraout_var;
  ulong uVar16;
  undefined4 extraout_var_00;
  ObjectTraits *pOVar17;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  char *pcVar18;
  long *plVar19;
  undefined8 *puVar20;
  size_t sVar21;
  ImageLayerVerifier *verifyLayer;
  int i;
  long lVar22;
  long *plVar23;
  size_type *psVar24;
  ulong *puVar25;
  TextureFormat *format;
  RenderContext *renderContext_00;
  undefined **ppuVar26;
  int x;
  int x_00;
  deUint32 bufferGL;
  ulong uVar27;
  char *pcVar28;
  RenderContext RVar29;
  undefined8 uVar30;
  undefined1 isSampler;
  int y;
  int y_00;
  int z;
  GLuint z_00;
  bool bVar31;
  GLenum local_ca8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ca0;
  undefined8 local_c80;
  GLuint local_c78;
  string curPixelInvocationNdx;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c28;
  GLuint local_c04;
  string wrapX_1;
  ulong *local_be0;
  long local_bd8;
  ulong local_bd0;
  long lStack_bc8;
  Functional *local_bc0;
  CallLogWrapper glLog;
  long *local_ba0;
  long local_b98;
  long local_b90;
  long lStack_b88;
  long *local_b80;
  long local_b78;
  long local_b70;
  long lStack_b68;
  long *local_b60;
  long local_b58;
  long local_b50;
  long lStack_b48;
  long *local_b40;
  long local_b38;
  long local_b30;
  long lStack_b28;
  long *local_b20;
  long local_b18;
  long local_b10;
  long lStack_b08;
  long *local_b00;
  long local_af8;
  long local_af0;
  long lStack_ae8;
  long *local_ae0;
  long local_ad8;
  long local_ad0;
  long lStack_ac8;
  long *local_ac0;
  long local_ab8;
  long local_ab0;
  long lStack_aa8;
  string atomicCoord;
  string colorScalarTypeName;
  ulong *local_a58;
  long local_a50;
  ulong local_a48;
  long lStack_a40;
  RenderContext *local_a38;
  long local_a30;
  RenderContext local_a28;
  undefined8 uStack_a20;
  ChannelType local_a14;
  ulong *local_a10;
  long local_a08;
  ulong local_a00;
  long lStack_9f8;
  ulong *local_9f0;
  long local_9e8;
  ulong local_9e0;
  long lStack_9d8;
  ulong *local_9d0;
  long local_9c8;
  ulong local_9c0 [2];
  ulong *local_9b0;
  long local_9a8;
  ulong local_9a0;
  undefined4 uStack_998;
  undefined4 uStack_994;
  ulong *local_990;
  long local_988;
  ulong local_980;
  undefined4 uStack_978;
  undefined4 uStack_974;
  ulong *local_970;
  long local_968;
  ulong local_960;
  undefined4 uStack_958;
  undefined4 uStack_954;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_950;
  long *local_930;
  undefined8 local_928;
  long local_920;
  undefined8 uStack_918;
  long *local_910;
  undefined8 local_908;
  long local_900;
  undefined8 uStack_8f8;
  long *local_8f0;
  undefined8 local_8e8;
  long local_8e0;
  undefined8 uStack_8d8;
  long *local_8d0;
  undefined8 local_8c8;
  long local_8c0;
  undefined8 uStack_8b8;
  long *local_8b0;
  undefined8 local_8a8;
  long local_8a0;
  undefined8 uStack_898;
  TextureFormat *local_890;
  ulong local_888;
  TestLog *local_880;
  long *local_878 [2];
  long local_868 [2];
  long *local_858 [2];
  long local_848 [2];
  long *local_838 [2];
  long local_828 [2];
  long *local_818 [2];
  long local_808 [2];
  ulong *local_7f8;
  long local_7f0;
  ulong local_7e8;
  undefined4 uStack_7e0;
  undefined4 uStack_7dc;
  long *local_7d8 [2];
  long local_7c8 [2];
  string colorVecTypeName;
  string shaderImageTypeStr;
  Vector<int,_3> res;
  ulong local_768;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  _Stack_760;
  ios_base local_708 [8];
  ios_base local_700 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d8;
  string local_5b8;
  string local_598;
  long *local_578;
  long local_570;
  long local_568;
  long lStack_560;
  long *local_558;
  long local_550;
  long local_548;
  long lStack_540;
  long *local_538;
  long local_530;
  long local_528;
  long lStack_520;
  long *local_518;
  long local_510;
  long local_508;
  long lStack_500;
  long *local_4f8;
  long local_4f0;
  long local_4e8;
  long lStack_4e0;
  long *local_4d8;
  long local_4d0;
  long local_4c8;
  long lStack_4c0;
  long *local_4b8;
  long local_4b0;
  long local_4a8;
  long lStack_4a0;
  long *local_498;
  long local_490;
  long local_488;
  long lStack_480;
  long *local_478;
  long local_470;
  long local_468;
  long lStack_460;
  long *local_458;
  long local_450;
  long local_448;
  long lStack_440;
  long *local_438;
  long local_430;
  long local_428;
  long lStack_420;
  long *local_418;
  long local_410;
  long local_408;
  long lStack_400;
  long *local_3f8;
  long local_3f0;
  long local_3e8;
  long lStack_3e0;
  long *local_3d8;
  long local_3d0;
  long local_3c8;
  long lStack_3c0;
  long *local_3b8;
  long local_3b0;
  long local_3a8;
  long lStack_3a0;
  long *local_398;
  long local_390;
  long local_388;
  long lStack_380;
  long *local_378;
  long local_370;
  long local_368;
  long lStack_360;
  long *local_358;
  long local_350;
  long local_348;
  undefined4 uStack_340;
  undefined4 uStack_33c;
  Texture returnValueTexture;
  Texture endResultTexture;
  string invocationCoord;
  long *local_2e8;
  long local_2e0;
  long local_2d8;
  long lStack_2d0;
  long *local_2c8;
  long local_2c0;
  long local_2b8;
  long lStack_2b0;
  long *local_2a8;
  long local_2a0;
  long local_298;
  long lStack_290;
  string shaderImageFormatStr;
  Buffer returnValueTextureBuf;
  Buffer endResultTextureBuf;
  string glslVersionDeclaration;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  uint local_1f8;
  value_type local_1f0;
  LayeredImage imageData;
  GLuint local_138;
  bool local_110;
  ProgramSources local_100;
  
  pFVar8 = (Functional *)((this->super_TestCase).m_context)->m_renderCtx;
  pTVar9 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar13 = (*(*(_func_int ***)pFVar8)[3])(pFVar8);
  glu::CallLogWrapper::CallLogWrapper(&glLog,(Functions *)CONCAT44(extraout_var,iVar13),pTVar9);
  dVar14 = glu::getInternalFormat(this->m_format);
  local_888 = (ulong)dVar14;
  uVar16 = (ulong)this->m_imageType;
  local_ca8 = 0xffffffff;
  if (uVar16 < 8) {
    local_ca8 = *(GLenum *)(&DAT_01c93968 + uVar16 * 4);
  }
  switch(uVar16) {
  case 0:
  case 1:
    local_c80 = 0x4000000040;
    goto LAB_0149f245;
  case 2:
  case 3:
    local_c80 = 0x4000000040;
    local_c78 = 8;
    break;
  default:
    local_c78 = 0xffffffff;
    local_c80 = 0xffffffffffffffff;
    break;
  case 7:
    local_c80 = 0x100000040;
LAB_0149f245:
    local_c78 = 1;
  }
  local_c04 = 6;
  if (this->m_imageType != TEXTURETYPE_CUBE) {
    local_c04 = local_c78;
  }
  CVar5 = (this->m_format).type;
  bVar31 = (CVar5 & ~SNORM_INT16) != UNSIGNED_INT8;
  iVar13 = (*(*(_func_int ***)pFVar8)[3])(pFVar8);
  pOVar17 = glu::objectTraits(OBJECTTYPE_BUFFER);
  glu::ObjectWrapper::ObjectWrapper
            (&endResultTextureBuf.super_ObjectWrapper,(Functions *)CONCAT44(extraout_var_00,iVar13),
             pOVar17);
  iVar13 = (*(*(_func_int ***)pFVar8)[3])(pFVar8);
  pOVar17 = glu::objectTraits(OBJECTTYPE_BUFFER);
  glu::ObjectWrapper::ObjectWrapper
            (&returnValueTextureBuf.super_ObjectWrapper,
             (Functions *)CONCAT44(extraout_var_01,iVar13),pOVar17);
  iVar13 = (*(*(_func_int ***)pFVar8)[3])();
  pOVar17 = glu::objectTraits(OBJECTTYPE_TEXTURE);
  glu::ObjectWrapper::ObjectWrapper
            (&endResultTexture.super_ObjectWrapper,(Functions *)CONCAT44(extraout_var_02,iVar13),
             pOVar17);
  iVar13 = (*(*(_func_int ***)pFVar8)[3])();
  pOVar17 = glu::objectTraits(OBJECTTYPE_TEXTURE);
  glu::ObjectWrapper::ObjectWrapper
            (&returnValueTexture.super_ObjectWrapper,(Functions *)CONCAT44(extraout_var_03,iVar13),
             pOVar17);
  glLog.m_enableLog = true;
  poVar2 = (ostringstream *)(res.m_data + 2);
  res.m_data._0_8_ = pTVar9;
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar2,"// Created a texture (name ",0x1b);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar2,") to act as the target of atomic operations",0x2b);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&res,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base(local_700);
  if (this->m_imageType == TEXTURETYPE_BUFFER) {
    poVar2 = (ostringstream *)(res.m_data + 2);
    res.m_data._0_8_ = pTVar9;
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,"// Created a buffer for the texture (name ",0x2a);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,")",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&res,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    std::ios_base::~ios_base(local_700);
  }
  if (this->m_caseType == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES) {
    poVar2 = (ostringstream *)(res.m_data + 2);
    res.m_data._0_8_ = pTVar9;
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,"// Created a texture (name ",0x1b);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,
               ") to which the intermediate return values of the atomic operation are stored",0x4c);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&res,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    std::ios_base::~ios_base(local_700);
    if (this->m_imageType == TEXTURETYPE_BUFFER) {
      poVar2 = (ostringstream *)(res.m_data + 2);
      res.m_data._0_8_ = pTVar9;
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar2,"// Created a buffer for the texture (name ",0x2a);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,")",1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&res,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar2);
      std::ios_base::~ios_base(local_700);
    }
  }
  uVar16 = local_c80;
  local_890 = &this->m_format;
  uVar11 = (uint)local_c80;
  iVar13 = local_c80._4_4_;
  local_bc0 = pFVar8;
  local_a14 = CVar5;
  local_880 = pTVar9;
  LayeredImage::LayeredImage
            (&imageData,this->m_imageType,local_890,(uint)local_c80,local_c80._4_4_,local_c78);
  if (0 < (int)local_c04) {
    z_00 = 0;
    do {
      if (0 < iVar13) {
        y_00 = 0;
        do {
          if (0 < (int)uVar11) {
            uVar27 = 0;
            do {
              x_00 = (int)uVar27;
              lVar22 = 0;
              do {
                res.m_data[lVar22] =
                     (int)(uVar27 / (uVar16 & 0xffffffff)) * 0x2a +
                     x_00 * x_00 + y_00 * y_00 + z_00 * z_00;
                lVar22 = lVar22 + 1;
              } while (lVar22 != 4);
              Functional::(anonymous_namespace)::LayeredImage::setPixel<tcu::Vector<int,4>>
                        ((LayeredImage *)&imageData,x_00,y_00,z_00,(Vector<int,_4> *)&res);
              uVar27 = (ulong)(x_00 + 1U);
            } while (x_00 + 1U != uVar11);
          }
          y_00 = y_00 + 1;
        } while (y_00 != iVar13);
      }
      z_00 = z_00 + 1;
    } while (z_00 != local_c04);
  }
  glu::CallLogWrapper::glActiveTexture(&glLog,0x84c0);
  pTVar9 = local_880;
  CVar12 = local_a14;
  pFVar8 = local_bc0;
  glu::CallLogWrapper::glBindTexture(&glLog,local_ca8,endResultTexture.super_ObjectWrapper.m_object)
  ;
  setTexParameteri(&glLog,local_ca8);
  poVar2 = (ostringstream *)(res.m_data + 2);
  res.m_data._0_8_ = pTVar9;
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar2,"// Filling end-result texture with initial pattern",0x32);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&res,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base(local_700);
  uploadTexture(&glLog,&imageData,endResultTextureBuf.super_ObjectWrapper.m_object);
  LayeredImage::~LayeredImage(&imageData);
  glu::CallLogWrapper::glBindImageTexture
            (&glLog,0,endResultTexture.super_ObjectWrapper.m_object,0,'\x01',0,0x88ba,
             (GLenum)local_888);
  lVar22 = (**(code **)(*(long *)pFVar8 + 0x18))(pFVar8);
  dVar14 = (**(code **)(lVar22 + 0x800))();
  glu::checkError(dVar14,"glBindImageTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                  ,0x951);
  if (this->m_caseType == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES) {
    glu::CallLogWrapper::glActiveTexture(&glLog,0x84c1);
    glu::CallLogWrapper::glBindTexture
              (&glLog,local_ca8,returnValueTexture.super_ObjectWrapper.m_object);
    setTexParameteri(&glLog,local_ca8);
    poVar2 = (ostringstream *)(res.m_data + 2);
    res.m_data._0_8_ = pTVar9;
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,"// Setting storage of return-value texture",0x2a);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&res,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    std::ios_base::~ios_base(local_700);
    TVar15 = this->m_imageType;
    imageData.m_type = TEXTURETYPE_1D;
    imageData.m_size.m_data[1] = 1;
    imageData.m_size.m_data[0] = (uint)(TVar15 == TEXTURETYPE_CUBE) * 4 + 1;
    res.m_data[0] = 0;
    res.m_data[1] = 0;
    stack0xfffffffffffff890 = (TestLog *)((ulong)stack0xfffffffffffff890 & 0xffffffff00000000);
    lVar22 = 0;
    do {
      res.m_data[lVar22] =
           imageData.m_size.m_data[lVar22 + -1] * *(int *)((long)&local_c80 + lVar22 * 4);
      lVar22 = lVar22 + 1;
    } while (lVar22 != 3);
    dVar14 = (deUint32)local_888;
    setTextureStorage(&glLog,TVar15,dVar14,&res,returnValueTextureBuf.super_ObjectWrapper.m_object);
    glu::CallLogWrapper::glBindImageTexture
              (&glLog,1,returnValueTexture.super_ObjectWrapper.m_object,0,'\x01',0,0x88b9,dVar14);
    lVar22 = (**(code **)(*(long *)pFVar8 + 0x18))(pFVar8);
    dVar14 = (**(code **)(lVar22 + 0x800))();
    glu::checkError(dVar14,"glBindImageTexture",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                    ,0x961);
  }
  pcVar18 = (char *)0x0;
  if (CVar12 - SIGNED_INT8 < 3) {
    pcVar18 = "int";
  }
  pcVar28 = "uint";
  if (CVar5 != UNSIGNED_INT32 && bVar31) {
    pcVar28 = pcVar18;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&colorScalarTypeName,pcVar28,(allocator<char> *)&res);
  pcVar18 = (char *)0x0;
  if (CVar12 - SIGNED_INT8 < 3) {
    pcVar18 = "i";
  }
  pcVar28 = "u";
  if (CVar5 != UNSIGNED_INT32 && bVar31) {
    pcVar28 = pcVar18;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&res,pcVar28,(allocator<char> *)&imageData);
  plVar19 = (long *)std::__cxx11::string::append((char *)&res);
  colorVecTypeName._M_dataplus._M_p = (pointer)&colorVecTypeName.field_2;
  psVar24 = (size_type *)(plVar19 + 2);
  if ((size_type *)*plVar19 == psVar24) {
    colorVecTypeName.field_2._M_allocated_capacity = *psVar24;
    colorVecTypeName.field_2._8_8_ = plVar19[3];
  }
  else {
    colorVecTypeName.field_2._M_allocated_capacity = *psVar24;
    colorVecTypeName._M_dataplus._M_p = (pointer)*plVar19;
  }
  colorVecTypeName._M_string_length = plVar19[1];
  *plVar19 = (long)psVar24;
  plVar19[1] = 0;
  *(undefined1 *)(plVar19 + 2) = 0;
  if ((ulong *)res.m_data._0_8_ != &local_768) {
    operator_delete((void *)res.m_data._0_8_,local_768 + 1);
  }
  TVar15 = this->m_imageType;
  iVar13 = (uint)local_c80;
  if (TVar15 == TEXTURETYPE_BUFFER) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&res);
    std::ostream::operator<<(&res,iVar13);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&res);
    std::ios_base::~ios_base(local_708);
    isSampler = 5;
    puVar20 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_ba0,0,(char *)0x0,0x1c9296f)
    ;
    atomicCoord._M_dataplus._M_p = (pointer)&atomicCoord.field_2;
    psVar24 = puVar20 + 2;
    if ((size_type *)*puVar20 == psVar24) {
      atomicCoord.field_2._M_allocated_capacity = *psVar24;
      atomicCoord.field_2._8_8_ = puVar20[3];
    }
    else {
      atomicCoord.field_2._M_allocated_capacity = *psVar24;
      atomicCoord._M_dataplus._M_p = (pointer)*puVar20;
    }
    atomicCoord._M_string_length = puVar20[1];
    *puVar20 = psVar24;
    bVar31 = false;
LAB_0149fd30:
    bVar10 = false;
  }
  else {
    if (TVar15 == TEXTURETYPE_2D) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&res);
      std::ostream::operator<<(&res,iVar13);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&res);
      std::ios_base::~ios_base(local_708);
      isSampler = 0xb;
      plVar19 = (long *)std::__cxx11::string::replace((ulong)local_7d8,0,(char *)0x0,0x1c92969);
      local_ba0 = &local_b90;
      plVar23 = plVar19 + 2;
      if ((long *)*plVar19 == plVar23) {
        local_b90 = *plVar23;
        lStack_b88 = plVar19[3];
      }
      else {
        local_b90 = *plVar23;
        local_ba0 = (long *)*plVar19;
      }
      local_b98 = plVar19[1];
      *plVar19 = (long)plVar23;
      plVar19[1] = 0;
      *(undefined1 *)(plVar19 + 2) = 0;
      puVar20 = (undefined8 *)std::__cxx11::string::append((char *)&local_ba0);
      atomicCoord._M_dataplus._M_p = (pointer)&atomicCoord.field_2;
      psVar24 = puVar20 + 2;
      if ((size_type *)*puVar20 == psVar24) {
        atomicCoord.field_2._M_allocated_capacity = *psVar24;
        atomicCoord.field_2._8_8_ = puVar20[3];
      }
      else {
        atomicCoord.field_2._M_allocated_capacity = *psVar24;
        atomicCoord._M_dataplus._M_p = (pointer)*puVar20;
      }
      atomicCoord._M_string_length = puVar20[1];
      *puVar20 = psVar24;
      bVar31 = true;
      goto LAB_0149fd30;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&res);
    std::ostream::operator<<(&res,iVar13);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&res);
    std::ios_base::~ios_base(local_708);
    isSampler = 0xb;
    plVar19 = (long *)std::__cxx11::string::replace((ulong)local_7d8,0,(char *)0x0,0x1c92975);
    local_ba0 = &local_b90;
    plVar23 = plVar19 + 2;
    if ((long *)*plVar19 == plVar23) {
      local_b90 = *plVar23;
      lStack_b88 = plVar19[3];
    }
    else {
      local_b90 = *plVar23;
      local_ba0 = (long *)*plVar19;
    }
    local_b98 = plVar19[1];
    *plVar19 = (long)plVar23;
    plVar19[1] = 0;
    *(undefined1 *)(plVar19 + 2) = 0;
    puVar20 = (undefined8 *)std::__cxx11::string::append((char *)&local_ba0);
    atomicCoord._M_dataplus._M_p = (pointer)&atomicCoord.field_2;
    psVar24 = puVar20 + 2;
    if ((size_type *)*puVar20 == psVar24) {
      atomicCoord.field_2._M_allocated_capacity = *psVar24;
      atomicCoord.field_2._8_8_ = puVar20[3];
    }
    else {
      atomicCoord.field_2._M_allocated_capacity = *psVar24;
      atomicCoord._M_dataplus._M_p = (pointer)*puVar20;
    }
    atomicCoord._M_string_length = puVar20[1];
    *puVar20 = psVar24;
    bVar10 = true;
    bVar31 = false;
  }
  puVar20[1] = 0;
  *(char *)psVar24 = '\0';
  if (bVar10) {
    if (local_ba0 != &local_b90) {
      operator_delete(local_ba0,local_b90 + 1);
    }
    if (local_7d8[0] != local_7c8) {
      operator_delete(local_7d8[0],local_7c8[0] + 1);
    }
  }
  if (bVar31) {
    if (local_ba0 != &local_b90) {
      operator_delete(local_ba0,local_b90 + 1);
    }
    if (local_7d8[0] != local_7c8) {
      operator_delete(local_7d8[0],local_7c8[0] + 1);
    }
  }
  if ((TVar15 == TEXTURETYPE_BUFFER) && (local_ba0 != &local_b90)) {
    operator_delete(local_ba0,local_b90 + 1);
  }
  pcVar18 = "ivec3(gx, gy, gz)";
  if (this->m_imageType == TEXTURETYPE_2D) {
    pcVar18 = "ivec2(gx, gy)";
  }
  pcVar28 = "gx";
  if (this->m_imageType != TEXTURETYPE_BUFFER) {
    pcVar28 = pcVar18;
  }
  invocationCoord._M_dataplus._M_p = (pointer)&invocationCoord.field_2;
  sVar21 = strlen(pcVar28);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&invocationCoord,pcVar28,pcVar28 + sVar21);
  getShaderImageFormatQualifier_abi_cxx11_(&shaderImageFormatStr,(Functional *)local_890,format);
  getShaderSamplerOrImageType_abi_cxx11_
            (&shaderImageTypeStr,(Functional *)(ulong)(this->m_format).type,this->m_imageType,
             TEXTURETYPE_2D,(bool)isSampler);
  type.super_ApiType.m_bits = (ApiType)(**(code **)(*(long *)pFVar8 + 0x10))(pFVar8);
  version = glu::getContextTypeGLSLVersion(type);
  pcVar18 = glu::getGLSLVersionDeclaration(version);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&glslVersionDeclaration,pcVar18,(allocator<char> *)&res);
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_100._193_8_ = 0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  memset(&local_100,0,0xac);
  local_9d0 = local_9c0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_9d0,glslVersionDeclaration._M_dataplus._M_p,
             glslVersionDeclaration._M_dataplus._M_p + glslVersionDeclaration._M_string_length);
  std::__cxx11::string::append((char *)&local_9d0);
  imageAtomicExtensionShaderRequires_abi_cxx11_(&local_598,pFVar8,renderContext_00);
  uVar16 = 0xf;
  if (local_9d0 != local_9c0) {
    uVar16 = local_9c0[0];
  }
  if (uVar16 < local_598._M_string_length + local_9c8) {
    uVar30 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_598._M_dataplus._M_p != &local_598.field_2) {
      uVar30 = local_598.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar30 < local_598._M_string_length + local_9c8) goto LAB_0149ff70;
    puVar20 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_598,0,(char *)0x0,(ulong)local_9d0);
  }
  else {
LAB_0149ff70:
    puVar20 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_9d0,(ulong)local_598._M_dataplus._M_p);
  }
  local_a38 = &local_a28;
  renderContext = (RenderContext *)(puVar20 + 2);
  if ((RenderContext *)*puVar20 == renderContext) {
    local_a28._vptr_RenderContext = renderContext->_vptr_RenderContext;
    uStack_a20 = puVar20[3];
  }
  else {
    local_a28._vptr_RenderContext = renderContext->_vptr_RenderContext;
    local_a38 = (RenderContext *)*puVar20;
  }
  local_a30 = puVar20[1];
  *puVar20 = renderContext;
  puVar20[1] = 0;
  *(undefined1 *)&renderContext->_vptr_RenderContext = 0;
  textureTypeExtensionShaderRequires_abi_cxx11_
            (&local_5b8,(Functional *)(ulong)this->m_imageType,(TextureType)pFVar8,renderContext);
  RVar29._vptr_RenderContext = (_func_int **)0xf;
  if (local_a38 != &local_a28) {
    RVar29._vptr_RenderContext = local_a28._vptr_RenderContext;
  }
  if (RVar29._vptr_RenderContext < (_func_int **)(local_5b8._M_string_length + local_a30)) {
    uVar30 = (_func_int **)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
      uVar30 = local_5b8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar30 < (_func_int **)(local_5b8._M_string_length + local_a30)) goto LAB_014a0056;
    puVar20 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_5b8,0,(char *)0x0,(ulong)local_a38);
  }
  else {
LAB_014a0056:
    puVar20 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_a38,(ulong)local_5b8._M_dataplus._M_p);
  }
  local_930 = &local_920;
  plVar19 = puVar20 + 2;
  if ((long *)*puVar20 == plVar19) {
    local_920 = *plVar19;
    uStack_918 = puVar20[3];
  }
  else {
    local_920 = *plVar19;
    local_930 = (long *)*puVar20;
  }
  local_928 = puVar20[1];
  *puVar20 = plVar19;
  puVar20[1] = 0;
  *(undefined1 *)plVar19 = 0;
  plVar19 = (long *)std::__cxx11::string::append((char *)&local_930);
  local_578 = &local_568;
  plVar23 = plVar19 + 2;
  if ((long *)*plVar19 == plVar23) {
    local_568 = *plVar23;
    lStack_560 = plVar19[3];
  }
  else {
    local_568 = *plVar23;
    local_578 = (long *)*plVar19;
  }
  local_570 = plVar19[1];
  *plVar19 = (long)plVar23;
  plVar19[1] = 0;
  *(undefined1 *)(plVar19 + 2) = 0;
  plVar19 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_578,(ulong)shaderImageTypeStr._M_dataplus._M_p);
  local_558 = &local_548;
  plVar23 = plVar19 + 2;
  if ((long *)*plVar19 == plVar23) {
    local_548 = *plVar23;
    lStack_540 = plVar19[3];
  }
  else {
    local_548 = *plVar23;
    local_558 = (long *)*plVar19;
  }
  local_550 = plVar19[1];
  *plVar19 = (long)plVar23;
  plVar19[1] = 0;
  *(undefined1 *)(plVar19 + 2) = 0;
  plVar19 = (long *)std::__cxx11::string::append((char *)&local_558);
  local_538 = &local_528;
  plVar23 = plVar19 + 2;
  if ((long *)*plVar19 == plVar23) {
    local_528 = *plVar23;
    lStack_520 = plVar19[3];
  }
  else {
    local_528 = *plVar23;
    local_538 = (long *)*plVar19;
  }
  local_530 = plVar19[1];
  *plVar19 = (long)plVar23;
  plVar19[1] = 0;
  *(undefined1 *)(plVar19 + 2) = 0;
  plVar19 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_538,(ulong)shaderImageFormatStr._M_dataplus._M_p);
  local_518 = &local_508;
  plVar23 = plVar19 + 2;
  if ((long *)*plVar19 == plVar23) {
    local_508 = *plVar23;
    lStack_500 = plVar19[3];
  }
  else {
    local_508 = *plVar23;
    local_518 = (long *)*plVar19;
  }
  local_510 = plVar19[1];
  *plVar19 = (long)plVar23;
  plVar19[1] = 0;
  *(undefined1 *)(plVar19 + 2) = 0;
  plVar19 = (long *)std::__cxx11::string::append((char *)&local_518);
  local_4f8 = &local_4e8;
  plVar23 = plVar19 + 2;
  if ((long *)*plVar19 == plVar23) {
    local_4e8 = *plVar23;
    lStack_4e0 = plVar19[3];
  }
  else {
    local_4e8 = *plVar23;
    local_4f8 = (long *)*plVar19;
  }
  local_4f0 = plVar19[1];
  *plVar19 = (long)plVar23;
  plVar19[1] = 0;
  *(undefined1 *)(plVar19 + 2) = 0;
  plVar19 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_4f8,(ulong)shaderImageTypeStr._M_dataplus._M_p);
  local_4d8 = &local_4c8;
  plVar23 = plVar19 + 2;
  if ((long *)*plVar19 == plVar23) {
    local_4c8 = *plVar23;
    lStack_4c0 = plVar19[3];
  }
  else {
    local_4c8 = *plVar23;
    local_4d8 = (long *)*plVar19;
  }
  local_4d0 = plVar19[1];
  *plVar19 = (long)plVar23;
  plVar19[1] = 0;
  *(undefined1 *)(plVar19 + 2) = 0;
  plVar19 = (long *)std::__cxx11::string::append((char *)&local_4d8);
  puVar25 = (ulong *)(plVar19 + 2);
  if ((ulong *)*plVar19 == puVar25) {
    local_980 = *puVar25;
    uStack_978 = (undefined4)plVar19[3];
    uStack_974 = *(undefined4 *)((long)plVar19 + 0x1c);
    local_990 = &local_980;
  }
  else {
    local_980 = *puVar25;
    local_990 = (ulong *)*plVar19;
  }
  local_988 = plVar19[1];
  *plVar19 = (long)puVar25;
  plVar19[1] = 0;
  *(undefined1 *)(plVar19 + 2) = 0;
  AVar6 = this->m_caseType;
  if (AVar6 == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES) {
    std::operator+(&local_218,"layout (",&shaderImageFormatStr);
    plVar19 = (long *)std::__cxx11::string::append((char *)&local_218);
    local_2e8 = &local_2d8;
    plVar23 = plVar19 + 2;
    if ((long *)*plVar19 == plVar23) {
      local_2d8 = *plVar23;
      lStack_2d0 = plVar19[3];
    }
    else {
      local_2d8 = *plVar23;
      local_2e8 = (long *)*plVar19;
    }
    local_2e0 = plVar19[1];
    *plVar19 = (long)plVar23;
    plVar19[1] = 0;
    *(undefined1 *)(plVar19 + 2) = 0;
    plVar19 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_2e8,(ulong)shaderImageTypeStr._M_dataplus._M_p);
    local_2c8 = &local_2b8;
    plVar23 = plVar19 + 2;
    if ((long *)*plVar19 == plVar23) {
      local_2b8 = *plVar23;
      lStack_2b0 = plVar19[3];
    }
    else {
      local_2b8 = *plVar23;
      local_2c8 = (long *)*plVar19;
    }
    local_2c0 = plVar19[1];
    *plVar19 = (long)plVar23;
    plVar19[1] = 0;
    *(undefined1 *)(plVar19 + 2) = 0;
    plVar19 = (long *)std::__cxx11::string::append((char *)&local_2c8);
    local_9f0 = &local_9e0;
    puVar25 = (ulong *)(plVar19 + 2);
    if ((ulong *)*plVar19 == puVar25) {
      local_9e0 = *puVar25;
      lStack_9d8 = plVar19[3];
    }
    else {
      local_9e0 = *puVar25;
      local_9f0 = (ulong *)*plVar19;
    }
    local_9e8 = plVar19[1];
    *plVar19 = (long)puVar25;
    plVar19[1] = 0;
    *(undefined1 *)(plVar19 + 2) = 0;
  }
  else {
    local_9f0 = &local_9e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_9f0,0x1b32ab9);
  }
  uVar16 = 0xf;
  if (local_990 != &local_980) {
    uVar16 = local_980;
  }
  if (uVar16 < (ulong)(local_9e8 + local_988)) {
    uVar16 = 0xf;
    if (local_9f0 != &local_9e0) {
      uVar16 = local_9e0;
    }
    if (uVar16 < (ulong)(local_9e8 + local_988)) goto LAB_014a0573;
    puVar20 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_9f0,0,(char *)0x0,(ulong)local_990);
  }
  else {
LAB_014a0573:
    puVar20 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_990,(ulong)local_9f0);
  }
  local_910 = &local_900;
  plVar19 = puVar20 + 2;
  if ((long *)*puVar20 == plVar19) {
    local_900 = *plVar19;
    uStack_8f8 = puVar20[3];
  }
  else {
    local_900 = *plVar19;
    local_910 = (long *)*puVar20;
  }
  local_908 = puVar20[1];
  *puVar20 = plVar19;
  puVar20[1] = 0;
  *(undefined1 *)plVar19 = 0;
  plVar19 = (long *)std::__cxx11::string::append((char *)&local_910);
  local_4b8 = &local_4a8;
  plVar23 = plVar19 + 2;
  if ((long *)*plVar19 == plVar23) {
    local_4a8 = *plVar23;
    lStack_4a0 = plVar19[3];
  }
  else {
    local_4a8 = *plVar23;
    local_4b8 = (long *)*plVar19;
  }
  local_4b0 = plVar19[1];
  *plVar19 = (long)plVar23;
  plVar19[1] = 0;
  *(undefined1 *)(plVar19 + 2) = 0;
  plVar19 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_4b8,(ulong)colorScalarTypeName._M_dataplus._M_p);
  local_498 = &local_488;
  plVar23 = plVar19 + 2;
  if ((long *)*plVar19 == plVar23) {
    local_488 = *plVar23;
    lStack_480 = plVar19[3];
  }
  else {
    local_488 = *plVar23;
    local_498 = (long *)*plVar19;
  }
  local_490 = plVar19[1];
  *plVar19 = (long)plVar23;
  plVar19[1] = 0;
  *(undefined1 *)(plVar19 + 2) = 0;
  plVar19 = (long *)std::__cxx11::string::append((char *)&local_498);
  local_478 = &local_468;
  plVar23 = plVar19 + 2;
  if ((long *)*plVar19 == plVar23) {
    local_468 = *plVar23;
    lStack_460 = plVar19[3];
  }
  else {
    local_468 = *plVar23;
    local_478 = (long *)*plVar19;
  }
  local_470 = plVar19[1];
  *plVar19 = (long)plVar23;
  plVar19[1] = 0;
  *(undefined1 *)(plVar19 + 2) = 0;
  plVar19 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_478,(ulong)colorScalarTypeName._M_dataplus._M_p);
  puVar25 = (ulong *)(plVar19 + 2);
  if ((ulong *)*plVar19 == puVar25) {
    local_960 = *puVar25;
    uStack_958 = (undefined4)plVar19[3];
    uStack_954 = *(undefined4 *)((long)plVar19 + 0x1c);
    local_970 = &local_960;
  }
  else {
    local_960 = *puVar25;
    local_970 = (ulong *)*plVar19;
  }
  local_968 = plVar19[1];
  *plVar19 = (long)puVar25;
  plVar19[1] = 0;
  *(undefined1 *)(plVar19 + 2) = 0;
  local_5d8._M_dataplus._M_p = (pointer)&local_5d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5d8,"gx","");
  local_818[0] = local_808;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_818,"gy","");
  local_838[0] = local_828;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_838,"gz","");
  iVar13 = (uint)local_c80;
  std::operator+(&local_c48,"(",&local_5d8);
  plVar19 = (long *)std::__cxx11::string::append((char *)&local_c48);
  paVar1 = &local_ca0.field_2;
  puVar25 = (ulong *)(plVar19 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar19 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar25) {
    local_ca0.field_2._M_allocated_capacity = *puVar25;
    local_ca0.field_2._8_8_ = plVar19[3];
    local_ca0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_ca0.field_2._M_allocated_capacity = *puVar25;
    local_ca0._M_dataplus._M_p = (pointer)*plVar19;
  }
  local_ca0._M_string_length = plVar19[1];
  *plVar19 = (long)puVar25;
  plVar19[1] = 0;
  *(undefined1 *)(plVar19 + 2) = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&res);
  std::ostream::operator<<(&res,iVar13);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&res);
  std::ios_base::~ios_base(local_708);
  uVar30 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ca0._M_dataplus._M_p != paVar1) {
    uVar30 = local_ca0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar30 < local_c28._M_string_length + local_ca0._M_string_length) {
    uVar30 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c28._M_dataplus._M_p != &local_c28.field_2) {
      uVar30 = local_c28.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar30 < local_c28._M_string_length + local_ca0._M_string_length) goto LAB_014a0910;
    puVar20 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_c28,0,(char *)0x0,(ulong)local_ca0._M_dataplus._M_p);
  }
  else {
LAB_014a0910:
    puVar20 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_ca0,(ulong)local_c28._M_dataplus._M_p);
  }
  curPixelInvocationNdx._M_dataplus._M_p = (pointer)&curPixelInvocationNdx.field_2;
  psVar24 = puVar20 + 2;
  if ((size_type *)*puVar20 == psVar24) {
    curPixelInvocationNdx.field_2._M_allocated_capacity = *psVar24;
    curPixelInvocationNdx.field_2._8_8_ = puVar20[3];
  }
  else {
    curPixelInvocationNdx.field_2._M_allocated_capacity = *psVar24;
    curPixelInvocationNdx._M_dataplus._M_p = (pointer)*puVar20;
  }
  curPixelInvocationNdx._M_string_length = puVar20[1];
  *puVar20 = psVar24;
  puVar20[1] = 0;
  *(char *)psVar24 = '\0';
  plVar19 = (long *)std::__cxx11::string::append((char *)&curPixelInvocationNdx);
  wrapX_1._M_dataplus._M_p = (pointer)&wrapX_1.field_2;
  psVar24 = (size_type *)(plVar19 + 2);
  if ((size_type *)*plVar19 == psVar24) {
    wrapX_1.field_2._M_allocated_capacity = *psVar24;
    wrapX_1.field_2._8_8_ = plVar19[3];
  }
  else {
    wrapX_1.field_2._M_allocated_capacity = *psVar24;
    wrapX_1._M_dataplus._M_p = (pointer)*plVar19;
  }
  wrapX_1._M_string_length = plVar19[1];
  *plVar19 = (long)psVar24;
  plVar19[1] = 0;
  *(undefined1 *)(plVar19 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)curPixelInvocationNdx._M_dataplus._M_p != &curPixelInvocationNdx.field_2) {
    operator_delete(curPixelInvocationNdx._M_dataplus._M_p,
                    curPixelInvocationNdx.field_2._M_allocated_capacity + 1);
  }
  paVar3 = &local_c28.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c28._M_dataplus._M_p != paVar3) {
    operator_delete(local_c28._M_dataplus._M_p,local_c28.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ca0._M_dataplus._M_p != paVar1) {
    operator_delete(local_ca0._M_dataplus._M_p,local_ca0.field_2._M_allocated_capacity + 1);
  }
  paVar4 = &local_c48.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c48._M_dataplus._M_p != paVar4) {
    operator_delete(local_c48._M_dataplus._M_p,local_c48.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_c28,"(",&local_5d8);
  plVar19 = (long *)std::__cxx11::string::append((char *)&local_c28);
  puVar25 = (ulong *)(plVar19 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar19 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar25) {
    local_c48.field_2._M_allocated_capacity = *puVar25;
    local_c48.field_2._8_8_ = plVar19[3];
    local_c48._M_dataplus._M_p = (pointer)paVar4;
  }
  else {
    local_c48.field_2._M_allocated_capacity = *puVar25;
    local_c48._M_dataplus._M_p = (pointer)*plVar19;
  }
  local_c48._M_string_length = plVar19[1];
  *plVar19 = (long)puVar25;
  plVar19[1] = 0;
  *(undefined1 *)(plVar19 + 2) = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&res);
  std::ostream::operator<<(&res,iVar13);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&res);
  std::ios_base::~ios_base(local_708);
  uVar30 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c48._M_dataplus._M_p != paVar4) {
    uVar30 = local_c48.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar30 < local_bd8 + local_c48._M_string_length) {
    uVar16 = 0xf;
    if (local_be0 != &local_bd0) {
      uVar16 = local_bd0;
    }
    if (uVar16 < local_bd8 + local_c48._M_string_length) goto LAB_014a0b68;
    puVar20 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_be0,0,(char *)0x0,(ulong)local_c48._M_dataplus._M_p);
  }
  else {
LAB_014a0b68:
    puVar20 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_c48,(ulong)local_be0);
  }
  psVar24 = puVar20 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar20 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar24) {
    local_ca0.field_2._M_allocated_capacity = *psVar24;
    local_ca0.field_2._8_8_ = puVar20[3];
    local_ca0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_ca0.field_2._M_allocated_capacity = *psVar24;
    local_ca0._M_dataplus._M_p = (pointer)*puVar20;
  }
  local_ca0._M_string_length = puVar20[1];
  *puVar20 = psVar24;
  puVar20[1] = 0;
  *(undefined1 *)psVar24 = 0;
  plVar19 = (long *)std::__cxx11::string::append((char *)&local_ca0);
  curPixelInvocationNdx._M_dataplus._M_p = (pointer)&curPixelInvocationNdx.field_2;
  psVar24 = (size_type *)(plVar19 + 2);
  if ((size_type *)*plVar19 == psVar24) {
    curPixelInvocationNdx.field_2._M_allocated_capacity = *psVar24;
    curPixelInvocationNdx.field_2._8_8_ = plVar19[3];
  }
  else {
    curPixelInvocationNdx.field_2._M_allocated_capacity = *psVar24;
    curPixelInvocationNdx._M_dataplus._M_p = (pointer)*plVar19;
  }
  curPixelInvocationNdx._M_string_length = plVar19[1];
  *plVar19 = (long)psVar24;
  plVar19[1] = 0;
  *(undefined1 *)(plVar19 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ca0._M_dataplus._M_p != paVar1) {
    operator_delete(local_ca0._M_dataplus._M_p,local_ca0.field_2._M_allocated_capacity + 1);
  }
  if (local_be0 != &local_bd0) {
    operator_delete(local_be0,local_bd0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c48._M_dataplus._M_p != paVar4) {
    operator_delete(local_c48._M_dataplus._M_p,local_c48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c28._M_dataplus._M_p != paVar3) {
    operator_delete(local_c28._M_dataplus._M_p,local_c28.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_950,"(",&wrapX_1);
  plVar19 = (long *)std::__cxx11::string::append((char *)&local_950);
  local_b80 = &local_b70;
  plVar23 = plVar19 + 2;
  if ((long *)*plVar19 == plVar23) {
    local_b70 = *plVar23;
    lStack_b68 = plVar19[3];
  }
  else {
    local_b70 = *plVar23;
    local_b80 = (long *)*plVar19;
  }
  local_b78 = plVar19[1];
  *plVar19 = (long)plVar23;
  plVar19[1] = 0;
  *(undefined1 *)(plVar19 + 2) = 0;
  plVar19 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_b80,(ulong)wrapX_1._M_dataplus._M_p);
  local_b60 = &local_b50;
  plVar23 = plVar19 + 2;
  if ((long *)*plVar19 == plVar23) {
    local_b50 = *plVar23;
    lStack_b48 = plVar19[3];
  }
  else {
    local_b50 = *plVar23;
    local_b60 = (long *)*plVar19;
  }
  local_b58 = plVar19[1];
  *plVar19 = (long)plVar23;
  plVar19[1] = 0;
  *(undefined1 *)(plVar19 + 2) = 0;
  plVar19 = (long *)std::__cxx11::string::append((char *)&local_b60);
  local_b40 = &local_b30;
  plVar23 = plVar19 + 2;
  if ((long *)*plVar19 == plVar23) {
    local_b30 = *plVar23;
    lStack_b28 = plVar19[3];
  }
  else {
    local_b30 = *plVar23;
    local_b40 = (long *)*plVar19;
  }
  local_b38 = plVar19[1];
  *plVar19 = (long)plVar23;
  plVar19[1] = 0;
  *(undefined1 *)(plVar19 + 2) = 0;
  plVar19 = (long *)std::__cxx11::string::_M_append((char *)&local_b40,(ulong)local_818[0]);
  local_b20 = &local_b10;
  plVar23 = plVar19 + 2;
  if ((long *)*plVar19 == plVar23) {
    local_b10 = *plVar23;
    lStack_b08 = plVar19[3];
  }
  else {
    local_b10 = *plVar23;
    local_b20 = (long *)*plVar19;
  }
  local_b18 = plVar19[1];
  *plVar19 = (long)plVar23;
  plVar19[1] = 0;
  *(undefined1 *)(plVar19 + 2) = 0;
  plVar19 = (long *)std::__cxx11::string::append((char *)&local_b20);
  local_b00 = &local_af0;
  plVar23 = plVar19 + 2;
  if ((long *)*plVar19 == plVar23) {
    local_af0 = *plVar23;
    lStack_ae8 = plVar19[3];
  }
  else {
    local_af0 = *plVar23;
    local_b00 = (long *)*plVar19;
  }
  local_af8 = plVar19[1];
  *plVar19 = (long)plVar23;
  plVar19[1] = 0;
  *(undefined1 *)(plVar19 + 2) = 0;
  plVar19 = (long *)std::__cxx11::string::_M_append((char *)&local_b00,(ulong)local_818[0]);
  local_ae0 = &local_ad0;
  plVar23 = plVar19 + 2;
  if ((long *)*plVar19 == plVar23) {
    local_ad0 = *plVar23;
    lStack_ac8 = plVar19[3];
  }
  else {
    local_ad0 = *plVar23;
    local_ae0 = (long *)*plVar19;
  }
  local_ad8 = plVar19[1];
  *plVar19 = (long)plVar23;
  plVar19[1] = 0;
  *(undefined1 *)(plVar19 + 2) = 0;
  plVar19 = (long *)std::__cxx11::string::append((char *)&local_ae0);
  local_ac0 = &local_ab0;
  plVar23 = plVar19 + 2;
  if ((long *)*plVar19 == plVar23) {
    local_ab0 = *plVar23;
    lStack_aa8 = plVar19[3];
  }
  else {
    local_ab0 = *plVar23;
    local_ac0 = (long *)*plVar19;
  }
  local_ab8 = plVar19[1];
  *plVar19 = (long)plVar23;
  plVar19[1] = 0;
  *(undefined1 *)(plVar19 + 2) = 0;
  plVar19 = (long *)std::__cxx11::string::_M_append((char *)&local_ac0,(ulong)local_838[0]);
  puVar25 = (ulong *)(plVar19 + 2);
  if ((ulong *)*plVar19 == puVar25) {
    local_bd0 = *puVar25;
    lStack_bc8 = plVar19[3];
    local_be0 = &local_bd0;
  }
  else {
    local_bd0 = *puVar25;
    local_be0 = (ulong *)*plVar19;
  }
  local_bd8 = plVar19[1];
  *plVar19 = (long)puVar25;
  plVar19[1] = 0;
  *(undefined1 *)(plVar19 + 2) = 0;
  plVar19 = (long *)std::__cxx11::string::append((char *)&local_be0);
  puVar25 = (ulong *)(plVar19 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar19 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar25) {
    local_c28.field_2._M_allocated_capacity = *puVar25;
    local_c28.field_2._8_8_ = plVar19[3];
    local_c28._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_c28.field_2._M_allocated_capacity = *puVar25;
    local_c28._M_dataplus._M_p = (pointer)*plVar19;
  }
  local_c28._M_string_length = plVar19[1];
  *plVar19 = (long)puVar25;
  plVar19[1] = 0;
  *(undefined1 *)(plVar19 + 2) = 0;
  plVar19 = (long *)std::__cxx11::string::_M_append((char *)&local_c28,(ulong)local_838[0]);
  psVar24 = (size_type *)(plVar19 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar19 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar24) {
    local_c48.field_2._M_allocated_capacity = *psVar24;
    local_c48.field_2._8_8_ = plVar19[3];
    local_c48._M_dataplus._M_p = (pointer)paVar4;
  }
  else {
    local_c48.field_2._M_allocated_capacity = *psVar24;
    local_c48._M_dataplus._M_p = (pointer)*plVar19;
  }
  local_c48._M_string_length = plVar19[1];
  *plVar19 = (long)psVar24;
  plVar19[1] = 0;
  *(undefined1 *)(plVar19 + 2) = 0;
  plVar19 = (long *)std::__cxx11::string::append((char *)&local_c48);
  psVar24 = (size_type *)(plVar19 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar19 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar24) {
    local_ca0.field_2._M_allocated_capacity = *psVar24;
    local_ca0.field_2._8_8_ = plVar19[3];
    local_ca0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_ca0.field_2._M_allocated_capacity = *psVar24;
    local_ca0._M_dataplus._M_p = (pointer)*plVar19;
  }
  local_ca0._M_string_length = plVar19[1];
  *plVar19 = (long)psVar24;
  plVar19[1] = 0;
  *(undefined1 *)(plVar19 + 2) = 0;
  plVar19 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_ca0,(ulong)curPixelInvocationNdx._M_dataplus._M_p);
  res.m_data._0_8_ = &local_768;
  puVar25 = (ulong *)(plVar19 + 2);
  if ((ulong *)*plVar19 == puVar25) {
    local_768 = *puVar25;
    _Stack_760._M_impl._0_8_ = plVar19[3];
  }
  else {
    local_768 = *puVar25;
    res.m_data._0_8_ = (ulong *)*plVar19;
  }
  unique0x00012000 = (TestLog *)plVar19[1];
  *plVar19 = (long)puVar25;
  plVar19[1] = 0;
  *(undefined1 *)(plVar19 + 2) = 0;
  plVar19 = (long *)std::__cxx11::string::append((char *)&res);
  puVar25 = (ulong *)(plVar19 + 2);
  if ((ulong *)*plVar19 == puVar25) {
    local_a00 = *puVar25;
    lStack_9f8 = plVar19[3];
    local_a10 = &local_a00;
  }
  else {
    local_a00 = *puVar25;
    local_a10 = (ulong *)*plVar19;
  }
  local_a08 = plVar19[1];
  *plVar19 = (long)puVar25;
  plVar19[1] = 0;
  *(undefined1 *)(plVar19 + 2) = 0;
  if ((ulong *)res.m_data._0_8_ != &local_768) {
    operator_delete((void *)res.m_data._0_8_,local_768 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ca0._M_dataplus._M_p != paVar1) {
    operator_delete(local_ca0._M_dataplus._M_p,local_ca0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c48._M_dataplus._M_p != paVar4) {
    operator_delete(local_c48._M_dataplus._M_p,local_c48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c28._M_dataplus._M_p != paVar3) {
    operator_delete(local_c28._M_dataplus._M_p,local_c28.field_2._M_allocated_capacity + 1);
  }
  if (local_be0 != &local_bd0) {
    operator_delete(local_be0,local_bd0 + 1);
  }
  if (local_ac0 != &local_ab0) {
    operator_delete(local_ac0,local_ab0 + 1);
  }
  if (local_ae0 != &local_ad0) {
    operator_delete(local_ae0,local_ad0 + 1);
  }
  if (local_b00 != &local_af0) {
    operator_delete(local_b00,local_af0 + 1);
  }
  if (local_b20 != &local_b10) {
    operator_delete(local_b20,local_b10 + 1);
  }
  if (local_b40 != &local_b30) {
    operator_delete(local_b40,local_b30 + 1);
  }
  if (local_b60 != &local_b50) {
    operator_delete(local_b60,local_b50 + 1);
  }
  if (local_b80 != &local_b70) {
    operator_delete(local_b80,local_b70 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_950._M_dataplus._M_p != &local_950.field_2) {
    operator_delete(local_950._M_dataplus._M_p,local_950.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)curPixelInvocationNdx._M_dataplus._M_p != &curPixelInvocationNdx.field_2) {
    operator_delete(curPixelInvocationNdx._M_dataplus._M_p,
                    curPixelInvocationNdx.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)wrapX_1._M_dataplus._M_p != &wrapX_1.field_2) {
    operator_delete(wrapX_1._M_dataplus._M_p,wrapX_1.field_2._M_allocated_capacity + 1);
  }
  uVar16 = 0xf;
  if (local_970 != &local_960) {
    uVar16 = local_960;
  }
  if (uVar16 < (ulong)(local_a08 + local_968)) {
    uVar16 = 0xf;
    if (local_a10 != &local_a00) {
      uVar16 = local_a00;
    }
    if (uVar16 < (ulong)(local_a08 + local_968)) goto LAB_014a140b;
    puVar20 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_a10,0,(char *)0x0,(ulong)local_970);
  }
  else {
LAB_014a140b:
    puVar20 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_970,(ulong)local_a10);
  }
  local_8f0 = &local_8e0;
  plVar19 = puVar20 + 2;
  if ((long *)*puVar20 == plVar19) {
    local_8e0 = *plVar19;
    uStack_8d8 = puVar20[3];
  }
  else {
    local_8e0 = *plVar19;
    local_8f0 = (long *)*puVar20;
  }
  local_8e8 = puVar20[1];
  *puVar20 = plVar19;
  puVar20[1] = 0;
  *(undefined1 *)plVar19 = 0;
  plVar19 = (long *)std::__cxx11::string::append((char *)&local_8f0);
  local_458 = &local_448;
  plVar23 = plVar19 + 2;
  if ((long *)*plVar19 == plVar23) {
    local_448 = *plVar23;
    lStack_440 = plVar19[3];
  }
  else {
    local_448 = *plVar23;
    local_458 = (long *)*plVar19;
  }
  local_450 = plVar19[1];
  *plVar19 = (long)plVar23;
  plVar19[1] = 0;
  *(undefined1 *)(plVar19 + 2) = 0;
  plVar19 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_458,(ulong)colorScalarTypeName._M_dataplus._M_p);
  local_438 = &local_428;
  plVar23 = plVar19 + 2;
  if ((long *)*plVar19 == plVar23) {
    local_428 = *plVar23;
    lStack_420 = plVar19[3];
  }
  else {
    local_428 = *plVar23;
    local_438 = (long *)*plVar19;
  }
  local_430 = plVar19[1];
  *plVar19 = (long)plVar23;
  plVar19[1] = 0;
  *(undefined1 *)(plVar19 + 2) = 0;
  plVar19 = (long *)std::__cxx11::string::append((char *)&local_438);
  local_418 = &local_408;
  plVar23 = plVar19 + 2;
  if ((long *)*plVar19 == plVar23) {
    local_408 = *plVar23;
    lStack_400 = plVar19[3];
  }
  else {
    local_408 = *plVar23;
    local_418 = (long *)*plVar19;
  }
  local_410 = plVar19[1];
  *plVar19 = (long)plVar23;
  plVar19[1] = 0;
  *(undefined1 *)(plVar19 + 2) = 0;
  plVar19 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_418,(ulong)colorScalarTypeName._M_dataplus._M_p);
  local_9b0 = &local_9a0;
  puVar25 = (ulong *)(plVar19 + 2);
  if ((ulong *)*plVar19 == puVar25) {
    local_9a0 = *puVar25;
    uStack_998 = (undefined4)plVar19[3];
    uStack_994 = *(undefined4 *)((long)plVar19 + 0x1c);
  }
  else {
    local_9a0 = *puVar25;
    local_9b0 = (ulong *)*plVar19;
  }
  local_9a8 = plVar19[1];
  *plVar19 = (long)puVar25;
  plVar19[1] = 0;
  *(undefined1 *)(plVar19 + 2) = 0;
  local_5f8._M_dataplus._M_p = (pointer)&local_5f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5f8,"gx","");
  local_858[0] = local_848;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_858,"gy","");
  local_878[0] = local_868;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_878,"gz","");
  iVar13 = (uint)local_c80;
  std::operator+(&local_c48,"(",&local_5f8);
  plVar19 = (long *)std::__cxx11::string::append((char *)&local_c48);
  puVar25 = (ulong *)(plVar19 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar19 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar25) {
    local_ca0.field_2._M_allocated_capacity = *puVar25;
    local_ca0.field_2._8_8_ = plVar19[3];
    local_ca0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_ca0.field_2._M_allocated_capacity = *puVar25;
    local_ca0._M_dataplus._M_p = (pointer)*plVar19;
  }
  local_ca0._M_string_length = plVar19[1];
  *plVar19 = (long)puVar25;
  plVar19[1] = 0;
  *(undefined1 *)(plVar19 + 2) = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&res);
  std::ostream::operator<<(&res,iVar13);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&res);
  std::ios_base::~ios_base(local_708);
  uVar30 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ca0._M_dataplus._M_p != paVar1) {
    uVar30 = local_ca0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar30 < local_c28._M_string_length + local_ca0._M_string_length) {
    uVar30 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c28._M_dataplus._M_p != paVar3) {
      uVar30 = local_c28.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar30 < local_c28._M_string_length + local_ca0._M_string_length) goto LAB_014a179f;
    puVar20 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_c28,0,(char *)0x0,(ulong)local_ca0._M_dataplus._M_p);
  }
  else {
LAB_014a179f:
    puVar20 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_ca0,(ulong)local_c28._M_dataplus._M_p);
  }
  curPixelInvocationNdx._M_dataplus._M_p = (pointer)&curPixelInvocationNdx.field_2;
  psVar24 = puVar20 + 2;
  if ((size_type *)*puVar20 == psVar24) {
    curPixelInvocationNdx.field_2._M_allocated_capacity = *psVar24;
    curPixelInvocationNdx.field_2._8_8_ = puVar20[3];
  }
  else {
    curPixelInvocationNdx.field_2._M_allocated_capacity = *psVar24;
    curPixelInvocationNdx._M_dataplus._M_p = (pointer)*puVar20;
  }
  curPixelInvocationNdx._M_string_length = puVar20[1];
  *puVar20 = psVar24;
  puVar20[1] = 0;
  *(char *)psVar24 = '\0';
  plVar19 = (long *)std::__cxx11::string::append((char *)&curPixelInvocationNdx);
  wrapX_1._M_dataplus._M_p = (pointer)&wrapX_1.field_2;
  psVar24 = (size_type *)(plVar19 + 2);
  if ((size_type *)*plVar19 == psVar24) {
    wrapX_1.field_2._M_allocated_capacity = *psVar24;
    wrapX_1.field_2._8_8_ = plVar19[3];
  }
  else {
    wrapX_1.field_2._M_allocated_capacity = *psVar24;
    wrapX_1._M_dataplus._M_p = (pointer)*plVar19;
  }
  wrapX_1._M_string_length = plVar19[1];
  *plVar19 = (long)psVar24;
  plVar19[1] = 0;
  *(undefined1 *)(plVar19 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)curPixelInvocationNdx._M_dataplus._M_p != &curPixelInvocationNdx.field_2) {
    operator_delete(curPixelInvocationNdx._M_dataplus._M_p,
                    curPixelInvocationNdx.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c28._M_dataplus._M_p != paVar3) {
    operator_delete(local_c28._M_dataplus._M_p,local_c28.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ca0._M_dataplus._M_p != paVar1) {
    operator_delete(local_ca0._M_dataplus._M_p,local_ca0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c48._M_dataplus._M_p != paVar4) {
    operator_delete(local_c48._M_dataplus._M_p,local_c48.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_c28,"(",&local_5f8);
  plVar19 = (long *)std::__cxx11::string::append((char *)&local_c28);
  puVar25 = (ulong *)(plVar19 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar19 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar25) {
    local_c48.field_2._M_allocated_capacity = *puVar25;
    local_c48.field_2._8_8_ = plVar19[3];
    local_c48._M_dataplus._M_p = (pointer)paVar4;
  }
  else {
    local_c48.field_2._M_allocated_capacity = *puVar25;
    local_c48._M_dataplus._M_p = (pointer)*plVar19;
  }
  local_c48._M_string_length = plVar19[1];
  *plVar19 = (long)puVar25;
  plVar19[1] = 0;
  *(undefined1 *)(plVar19 + 2) = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&res);
  std::ostream::operator<<(&res,iVar13);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&res);
  std::ios_base::~ios_base(local_708);
  uVar30 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c48._M_dataplus._M_p != paVar4) {
    uVar30 = local_c48.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar30 < local_bd8 + local_c48._M_string_length) {
    uVar16 = 0xf;
    if (local_be0 != &local_bd0) {
      uVar16 = local_bd0;
    }
    if (uVar16 < local_bd8 + local_c48._M_string_length) goto LAB_014a19ee;
    puVar20 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_be0,0,(char *)0x0,(ulong)local_c48._M_dataplus._M_p);
  }
  else {
LAB_014a19ee:
    puVar20 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_c48,(ulong)local_be0);
  }
  psVar24 = puVar20 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar20 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar24) {
    local_ca0.field_2._M_allocated_capacity = *psVar24;
    local_ca0.field_2._8_8_ = puVar20[3];
    local_ca0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_ca0.field_2._M_allocated_capacity = *psVar24;
    local_ca0._M_dataplus._M_p = (pointer)*puVar20;
  }
  local_ca0._M_string_length = puVar20[1];
  *puVar20 = psVar24;
  puVar20[1] = 0;
  *(undefined1 *)psVar24 = 0;
  plVar19 = (long *)std::__cxx11::string::append((char *)&local_ca0);
  curPixelInvocationNdx._M_dataplus._M_p = (pointer)&curPixelInvocationNdx.field_2;
  psVar24 = (size_type *)(plVar19 + 2);
  if ((size_type *)*plVar19 == psVar24) {
    curPixelInvocationNdx.field_2._M_allocated_capacity = *psVar24;
    curPixelInvocationNdx.field_2._8_8_ = plVar19[3];
  }
  else {
    curPixelInvocationNdx.field_2._M_allocated_capacity = *psVar24;
    curPixelInvocationNdx._M_dataplus._M_p = (pointer)*plVar19;
  }
  curPixelInvocationNdx._M_string_length = plVar19[1];
  *plVar19 = (long)psVar24;
  plVar19[1] = 0;
  *(undefined1 *)(plVar19 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ca0._M_dataplus._M_p != paVar1) {
    operator_delete(local_ca0._M_dataplus._M_p,local_ca0.field_2._M_allocated_capacity + 1);
  }
  if (local_be0 != &local_bd0) {
    operator_delete(local_be0,local_bd0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c48._M_dataplus._M_p != paVar4) {
    operator_delete(local_c48._M_dataplus._M_p,local_c48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c28._M_dataplus._M_p != paVar3) {
    operator_delete(local_c28._M_dataplus._M_p,local_c28.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_950,"(",&wrapX_1);
  plVar19 = (long *)std::__cxx11::string::append((char *)&local_950);
  local_b80 = &local_b70;
  plVar23 = plVar19 + 2;
  if ((long *)*plVar19 == plVar23) {
    local_b70 = *plVar23;
    lStack_b68 = plVar19[3];
  }
  else {
    local_b70 = *plVar23;
    local_b80 = (long *)*plVar19;
  }
  local_b78 = plVar19[1];
  *plVar19 = (long)plVar23;
  plVar19[1] = 0;
  *(undefined1 *)(plVar19 + 2) = 0;
  plVar19 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_b80,(ulong)wrapX_1._M_dataplus._M_p);
  local_b60 = &local_b50;
  plVar23 = plVar19 + 2;
  if ((long *)*plVar19 == plVar23) {
    local_b50 = *plVar23;
    lStack_b48 = plVar19[3];
  }
  else {
    local_b50 = *plVar23;
    local_b60 = (long *)*plVar19;
  }
  local_b58 = plVar19[1];
  *plVar19 = (long)plVar23;
  plVar19[1] = 0;
  *(undefined1 *)(plVar19 + 2) = 0;
  plVar19 = (long *)std::__cxx11::string::append((char *)&local_b60);
  local_b40 = &local_b30;
  plVar23 = plVar19 + 2;
  if ((long *)*plVar19 == plVar23) {
    local_b30 = *plVar23;
    lStack_b28 = plVar19[3];
  }
  else {
    local_b30 = *plVar23;
    local_b40 = (long *)*plVar19;
  }
  local_b38 = plVar19[1];
  *plVar19 = (long)plVar23;
  plVar19[1] = 0;
  *(undefined1 *)(plVar19 + 2) = 0;
  plVar19 = (long *)std::__cxx11::string::_M_append((char *)&local_b40,(ulong)local_858[0]);
  local_b20 = &local_b10;
  plVar23 = plVar19 + 2;
  if ((long *)*plVar19 == plVar23) {
    local_b10 = *plVar23;
    lStack_b08 = plVar19[3];
  }
  else {
    local_b10 = *plVar23;
    local_b20 = (long *)*plVar19;
  }
  local_b18 = plVar19[1];
  *plVar19 = (long)plVar23;
  plVar19[1] = 0;
  *(undefined1 *)(plVar19 + 2) = 0;
  plVar19 = (long *)std::__cxx11::string::append((char *)&local_b20);
  local_b00 = &local_af0;
  plVar23 = plVar19 + 2;
  if ((long *)*plVar19 == plVar23) {
    local_af0 = *plVar23;
    lStack_ae8 = plVar19[3];
  }
  else {
    local_af0 = *plVar23;
    local_b00 = (long *)*plVar19;
  }
  local_af8 = plVar19[1];
  *plVar19 = (long)plVar23;
  plVar19[1] = 0;
  *(undefined1 *)(plVar19 + 2) = 0;
  plVar19 = (long *)std::__cxx11::string::_M_append((char *)&local_b00,(ulong)local_858[0]);
  local_ae0 = &local_ad0;
  plVar23 = plVar19 + 2;
  if ((long *)*plVar19 == plVar23) {
    local_ad0 = *plVar23;
    lStack_ac8 = plVar19[3];
  }
  else {
    local_ad0 = *plVar23;
    local_ae0 = (long *)*plVar19;
  }
  local_ad8 = plVar19[1];
  *plVar19 = (long)plVar23;
  plVar19[1] = 0;
  *(undefined1 *)(plVar19 + 2) = 0;
  plVar19 = (long *)std::__cxx11::string::append((char *)&local_ae0);
  local_ac0 = &local_ab0;
  plVar23 = plVar19 + 2;
  if ((long *)*plVar19 == plVar23) {
    local_ab0 = *plVar23;
    lStack_aa8 = plVar19[3];
  }
  else {
    local_ab0 = *plVar23;
    local_ac0 = (long *)*plVar19;
  }
  local_ab8 = plVar19[1];
  *plVar19 = (long)plVar23;
  plVar19[1] = 0;
  *(undefined1 *)(plVar19 + 2) = 0;
  plVar19 = (long *)std::__cxx11::string::_M_append((char *)&local_ac0,(ulong)local_878[0]);
  puVar25 = (ulong *)(plVar19 + 2);
  if ((ulong *)*plVar19 == puVar25) {
    local_bd0 = *puVar25;
    lStack_bc8 = plVar19[3];
    local_be0 = &local_bd0;
  }
  else {
    local_bd0 = *puVar25;
    local_be0 = (ulong *)*plVar19;
  }
  local_bd8 = plVar19[1];
  *plVar19 = (long)puVar25;
  plVar19[1] = 0;
  *(undefined1 *)(plVar19 + 2) = 0;
  plVar19 = (long *)std::__cxx11::string::append((char *)&local_be0);
  psVar24 = (size_type *)(plVar19 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar19 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar24) {
    local_c28.field_2._M_allocated_capacity = *psVar24;
    local_c28.field_2._8_8_ = plVar19[3];
    local_c28._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_c28.field_2._M_allocated_capacity = *psVar24;
    local_c28._M_dataplus._M_p = (pointer)*plVar19;
  }
  local_c28._M_string_length = plVar19[1];
  *plVar19 = (long)psVar24;
  plVar19[1] = 0;
  *(undefined1 *)(plVar19 + 2) = 0;
  plVar19 = (long *)std::__cxx11::string::_M_append((char *)&local_c28,(ulong)local_878[0]);
  psVar24 = (size_type *)(plVar19 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar19 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar24) {
    local_c48.field_2._M_allocated_capacity = *psVar24;
    local_c48.field_2._8_8_ = plVar19[3];
    local_c48._M_dataplus._M_p = (pointer)paVar4;
  }
  else {
    local_c48.field_2._M_allocated_capacity = *psVar24;
    local_c48._M_dataplus._M_p = (pointer)*plVar19;
  }
  local_c48._M_string_length = plVar19[1];
  *plVar19 = (long)psVar24;
  plVar19[1] = 0;
  *(undefined1 *)(plVar19 + 2) = 0;
  plVar19 = (long *)std::__cxx11::string::append((char *)&local_c48);
  psVar24 = (size_type *)(plVar19 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar19 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar24) {
    local_ca0.field_2._M_allocated_capacity = *psVar24;
    local_ca0.field_2._8_8_ = plVar19[3];
    local_ca0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_ca0.field_2._M_allocated_capacity = *psVar24;
    local_ca0._M_dataplus._M_p = (pointer)*plVar19;
  }
  local_ca0._M_string_length = plVar19[1];
  *plVar19 = (long)psVar24;
  plVar19[1] = 0;
  *(undefined1 *)(plVar19 + 2) = 0;
  plVar19 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_ca0,(ulong)curPixelInvocationNdx._M_dataplus._M_p);
  puVar25 = (ulong *)(plVar19 + 2);
  if ((ulong *)*plVar19 == puVar25) {
    local_768 = *puVar25;
    _Stack_760._M_impl._0_8_ = plVar19[3];
    res.m_data._0_8_ = &local_768;
  }
  else {
    local_768 = *puVar25;
    res.m_data._0_8_ = (ulong *)*plVar19;
  }
  unique0x00012000 = (TestLog *)plVar19[1];
  *plVar19 = (long)puVar25;
  plVar19[1] = 0;
  *(undefined1 *)(plVar19 + 2) = 0;
  plVar19 = (long *)std::__cxx11::string::append((char *)&res);
  local_a58 = &local_a48;
  puVar25 = (ulong *)(plVar19 + 2);
  if ((ulong *)*plVar19 == puVar25) {
    local_a48 = *puVar25;
    lStack_a40 = plVar19[3];
  }
  else {
    local_a48 = *puVar25;
    local_a58 = (ulong *)*plVar19;
  }
  local_a50 = plVar19[1];
  *plVar19 = (long)puVar25;
  plVar19[1] = 0;
  *(undefined1 *)(plVar19 + 2) = 0;
  if ((ulong *)res.m_data._0_8_ != &local_768) {
    operator_delete((void *)res.m_data._0_8_,local_768 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ca0._M_dataplus._M_p != paVar1) {
    operator_delete(local_ca0._M_dataplus._M_p,local_ca0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c48._M_dataplus._M_p != paVar4) {
    operator_delete(local_c48._M_dataplus._M_p,local_c48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c28._M_dataplus._M_p != paVar3) {
    operator_delete(local_c28._M_dataplus._M_p,local_c28.field_2._M_allocated_capacity + 1);
  }
  if (local_be0 != &local_bd0) {
    operator_delete(local_be0,local_bd0 + 1);
  }
  if (local_ac0 != &local_ab0) {
    operator_delete(local_ac0,local_ab0 + 1);
  }
  if (local_ae0 != &local_ad0) {
    operator_delete(local_ae0,local_ad0 + 1);
  }
  if (local_b00 != &local_af0) {
    operator_delete(local_b00,local_af0 + 1);
  }
  if (local_b20 != &local_b10) {
    operator_delete(local_b20,local_b10 + 1);
  }
  if (local_b40 != &local_b30) {
    operator_delete(local_b40,local_b30 + 1);
  }
  if (local_b60 != &local_b50) {
    operator_delete(local_b60,local_b50 + 1);
  }
  if (local_b80 != &local_b70) {
    operator_delete(local_b80,local_b70 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_950._M_dataplus._M_p != &local_950.field_2) {
    operator_delete(local_950._M_dataplus._M_p,local_950.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)curPixelInvocationNdx._M_dataplus._M_p != &curPixelInvocationNdx.field_2) {
    operator_delete(curPixelInvocationNdx._M_dataplus._M_p,
                    curPixelInvocationNdx.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)wrapX_1._M_dataplus._M_p != &wrapX_1.field_2) {
    operator_delete(wrapX_1._M_dataplus._M_p,wrapX_1.field_2._M_allocated_capacity + 1);
  }
  uVar16 = 0xf;
  if (local_9b0 != &local_9a0) {
    uVar16 = local_9a0;
  }
  if (uVar16 < (ulong)(local_a50 + local_9a8)) {
    uVar16 = 0xf;
    if (local_a58 != &local_a48) {
      uVar16 = local_a48;
    }
    if (uVar16 < (ulong)(local_a50 + local_9a8)) goto LAB_014a22a6;
    puVar20 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_a58,0,(char *)0x0,(ulong)local_9b0);
  }
  else {
LAB_014a22a6:
    puVar20 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_9b0,(ulong)local_a58);
  }
  local_8d0 = &local_8c0;
  plVar19 = puVar20 + 2;
  if ((long *)*puVar20 == plVar19) {
    local_8c0 = *plVar19;
    uStack_8b8 = puVar20[3];
  }
  else {
    local_8c0 = *plVar19;
    local_8d0 = (long *)*puVar20;
  }
  local_8c8 = puVar20[1];
  *puVar20 = plVar19;
  puVar20[1] = 0;
  *(undefined1 *)plVar19 = 0;
  plVar19 = (long *)std::__cxx11::string::append((char *)&local_8d0);
  local_3f8 = &local_3e8;
  plVar23 = plVar19 + 2;
  if ((long *)*plVar19 == plVar23) {
    local_3e8 = *plVar23;
    lStack_3e0 = plVar19[3];
  }
  else {
    local_3e8 = *plVar23;
    local_3f8 = (long *)*plVar19;
  }
  local_3f0 = plVar19[1];
  *plVar19 = (long)plVar23;
  plVar19[1] = 0;
  *(undefined1 *)(plVar19 + 2) = 0;
  plVar19 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_3f8,(ulong)colorScalarTypeName._M_dataplus._M_p);
  local_3d8 = &local_3c8;
  plVar23 = plVar19 + 2;
  if ((long *)*plVar19 == plVar23) {
    local_3c8 = *plVar23;
    lStack_3c0 = plVar19[3];
  }
  else {
    local_3c8 = *plVar23;
    local_3d8 = (long *)*plVar19;
  }
  local_3d0 = plVar19[1];
  *plVar19 = (long)plVar23;
  plVar19[1] = 0;
  *(undefined1 *)(plVar19 + 2) = 0;
  plVar19 = (long *)std::__cxx11::string::append((char *)&local_3d8);
  local_3b8 = &local_3a8;
  plVar23 = plVar19 + 2;
  if ((long *)*plVar19 == plVar23) {
    local_3a8 = *plVar23;
    lStack_3a0 = plVar19[3];
  }
  else {
    local_3a8 = *plVar23;
    local_3b8 = (long *)*plVar19;
  }
  local_3b0 = plVar19[1];
  *plVar19 = (long)plVar23;
  plVar19[1] = 0;
  *(undefined1 *)(plVar19 + 2) = 0;
  plVar19 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_3b8,(ulong)colorScalarTypeName._M_dataplus._M_p);
  local_398 = &local_388;
  plVar23 = plVar19 + 2;
  if ((long *)*plVar19 == plVar23) {
    local_388 = *plVar23;
    lStack_380 = plVar19[3];
  }
  else {
    local_388 = *plVar23;
    local_398 = (long *)*plVar19;
  }
  local_390 = plVar19[1];
  *plVar19 = (long)plVar23;
  plVar19[1] = 0;
  *(undefined1 *)(plVar19 + 2) = 0;
  plVar19 = (long *)std::__cxx11::string::append((char *)&local_398);
  local_378 = &local_368;
  plVar23 = plVar19 + 2;
  if ((long *)*plVar19 == plVar23) {
    local_368 = *plVar23;
    lStack_360 = plVar19[3];
  }
  else {
    local_368 = *plVar23;
    local_378 = (long *)*plVar19;
  }
  local_370 = plVar19[1];
  *plVar19 = (long)plVar23;
  plVar19[1] = 0;
  *(undefined1 *)(plVar19 + 2) = 0;
  plVar19 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_378,(ulong)atomicCoord._M_dataplus._M_p);
  plVar23 = plVar19 + 2;
  if ((long *)*plVar19 == plVar23) {
    local_298 = *plVar23;
    lStack_290 = plVar19[3];
    local_2a8 = &local_298;
  }
  else {
    local_298 = *plVar23;
    local_2a8 = (long *)*plVar19;
  }
  local_2a0 = plVar19[1];
  *plVar19 = (long)plVar23;
  plVar19[1] = 0;
  *(undefined1 *)(plVar19 + 2) = 0;
  plVar19 = (long *)std::__cxx11::string::append((char *)&local_2a8);
  puVar25 = (ulong *)(plVar19 + 2);
  if ((ulong *)*plVar19 == puVar25) {
    local_7e8 = *puVar25;
    uStack_7e0 = (undefined4)plVar19[3];
    uStack_7dc = *(undefined4 *)((long)plVar19 + 0x1c);
    local_7f8 = &local_7e8;
  }
  else {
    local_7e8 = *puVar25;
    local_7f8 = (ulong *)*plVar19;
  }
  local_7f0 = plVar19[1];
  *plVar19 = (long)puVar25;
  plVar19[1] = 0;
  *(undefined1 *)(plVar19 + 2) = 0;
  AVar7 = this->m_caseType;
  if (AVar7 == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES) {
    std::operator+(&local_ca0,"\timageStore(u_returnValues, ",&invocationCoord);
    plVar19 = (long *)std::__cxx11::string::append((char *)&local_ca0);
    psVar24 = (size_type *)(plVar19 + 2);
    if ((size_type *)*plVar19 == psVar24) {
      curPixelInvocationNdx.field_2._M_allocated_capacity = *psVar24;
      curPixelInvocationNdx.field_2._8_8_ = plVar19[3];
      curPixelInvocationNdx._M_dataplus._M_p = (pointer)&curPixelInvocationNdx.field_2;
    }
    else {
      curPixelInvocationNdx.field_2._M_allocated_capacity = *psVar24;
      curPixelInvocationNdx._M_dataplus._M_p = (pointer)*plVar19;
    }
    curPixelInvocationNdx._M_string_length = plVar19[1];
    *plVar19 = (long)psVar24;
    plVar19[1] = 0;
    *(undefined1 *)(plVar19 + 2) = 0;
    plVar19 = (long *)std::__cxx11::string::_M_append
                                ((char *)&curPixelInvocationNdx,
                                 (ulong)colorVecTypeName._M_dataplus._M_p);
    psVar24 = (size_type *)(plVar19 + 2);
    if ((size_type *)*plVar19 == psVar24) {
      wrapX_1.field_2._M_allocated_capacity = *psVar24;
      wrapX_1.field_2._8_8_ = plVar19[3];
      wrapX_1._M_dataplus._M_p = (pointer)&wrapX_1.field_2;
    }
    else {
      wrapX_1.field_2._M_allocated_capacity = *psVar24;
      wrapX_1._M_dataplus._M_p = (pointer)*plVar19;
    }
    wrapX_1._M_string_length = plVar19[1];
    *plVar19 = (long)psVar24;
    plVar19[1] = 0;
    *(undefined1 *)(plVar19 + 2) = 0;
    plVar19 = (long *)std::__cxx11::string::append((char *)&wrapX_1);
    res.m_data._0_8_ = &local_768;
    puVar25 = (ulong *)(plVar19 + 2);
    if ((ulong *)*plVar19 == puVar25) {
      local_768 = *puVar25;
      _Stack_760._M_impl._0_8_ = plVar19[3];
    }
    else {
      local_768 = *puVar25;
      res.m_data._0_8_ = (ulong *)*plVar19;
    }
    unique0x00012000 = (TestLog *)plVar19[1];
    *plVar19 = (long)puVar25;
    plVar19[1] = 0;
    *(undefined1 *)(plVar19 + 2) = 0;
  }
  else {
    res.m_data._0_8_ = &local_768;
    std::__cxx11::string::_M_construct<char_const*>((string *)&res,0x1b32ab9);
  }
  uVar16 = 0xf;
  if (local_7f8 != &local_7e8) {
    uVar16 = local_7e8;
  }
  if (uVar16 < (ulong)((long)stack0xfffffffffffff890 + local_7f0)) {
    uVar16 = 0xf;
    if ((ulong *)res.m_data._0_8_ != &local_768) {
      uVar16 = local_768;
    }
    if (uVar16 < (ulong)((long)stack0xfffffffffffff890 + local_7f0)) goto LAB_014a27b9;
    puVar20 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&res,0,(char *)0x0,(ulong)local_7f8);
  }
  else {
LAB_014a27b9:
    puVar20 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_7f8,res.m_data._0_8_);
  }
  local_8b0 = &local_8a0;
  plVar19 = puVar20 + 2;
  if ((long *)*puVar20 == plVar19) {
    local_8a0 = *plVar19;
    uStack_898 = puVar20[3];
  }
  else {
    local_8a0 = *plVar19;
    local_8b0 = (long *)*puVar20;
  }
  local_8a8 = puVar20[1];
  *puVar20 = plVar19;
  puVar20[1] = 0;
  *(undefined1 *)plVar19 = 0;
  plVar19 = (long *)std::__cxx11::string::append((char *)&local_8b0);
  plVar23 = plVar19 + 2;
  if ((long *)*plVar19 == plVar23) {
    local_348 = *plVar23;
    uStack_340 = (undefined4)plVar19[3];
    uStack_33c = *(undefined4 *)((long)plVar19 + 0x1c);
    local_358 = &local_348;
  }
  else {
    local_348 = *plVar23;
    local_358 = (long *)*plVar19;
  }
  local_350 = plVar19[1];
  *plVar19 = (long)plVar23;
  plVar19[1] = 0;
  *(undefined1 *)(plVar19 + 2) = 0;
  local_1f8 = 5;
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1f0,local_358,local_350 + (long)local_358);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_100.sources + local_1f8,&local_1f0);
  glu::ShaderProgram::ShaderProgram
            ((ShaderProgram *)&imageData,(RenderContext *)local_bc0,&local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if (local_358 != &local_348) {
    operator_delete(local_358,local_348 + 1);
  }
  if (local_8b0 != &local_8a0) {
    operator_delete(local_8b0,local_8a0 + 1);
  }
  if ((ulong *)res.m_data._0_8_ != &local_768) {
    operator_delete((void *)res.m_data._0_8_,local_768 + 1);
  }
  if (AVar7 == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)wrapX_1._M_dataplus._M_p != &wrapX_1.field_2) {
      operator_delete(wrapX_1._M_dataplus._M_p,wrapX_1.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)curPixelInvocationNdx._M_dataplus._M_p != &curPixelInvocationNdx.field_2) {
      operator_delete(curPixelInvocationNdx._M_dataplus._M_p,
                      curPixelInvocationNdx.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ca0._M_dataplus._M_p != &local_ca0.field_2) {
      operator_delete(local_ca0._M_dataplus._M_p,local_ca0.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_7f8 != &local_7e8) {
    operator_delete(local_7f8,local_7e8 + 1);
  }
  if (local_2a8 != &local_298) {
    operator_delete(local_2a8,local_298 + 1);
  }
  if (local_378 != &local_368) {
    operator_delete(local_378,local_368 + 1);
  }
  if (local_398 != &local_388) {
    operator_delete(local_398,local_388 + 1);
  }
  if (local_3b8 != &local_3a8) {
    operator_delete(local_3b8,local_3a8 + 1);
  }
  if (local_3d8 != &local_3c8) {
    operator_delete(local_3d8,local_3c8 + 1);
  }
  if (local_3f8 != &local_3e8) {
    operator_delete(local_3f8,local_3e8 + 1);
  }
  if (local_8d0 != &local_8c0) {
    operator_delete(local_8d0,local_8c0 + 1);
  }
  if (local_a58 != &local_a48) {
    operator_delete(local_a58,local_a48 + 1);
  }
  if (local_878[0] != local_868) {
    operator_delete(local_878[0],local_868[0] + 1);
  }
  if (local_858[0] != local_848) {
    operator_delete(local_858[0],local_848[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
    operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
  }
  if (local_9b0 != &local_9a0) {
    operator_delete(local_9b0,local_9a0 + 1);
  }
  if (local_418 != &local_408) {
    operator_delete(local_418,local_408 + 1);
  }
  if (local_438 != &local_428) {
    operator_delete(local_438,local_428 + 1);
  }
  if (local_458 != &local_448) {
    operator_delete(local_458,local_448 + 1);
  }
  if (local_8f0 != &local_8e0) {
    operator_delete(local_8f0,local_8e0 + 1);
  }
  if (local_a10 != &local_a00) {
    operator_delete(local_a10,local_a00 + 1);
  }
  if (local_838[0] != local_828) {
    operator_delete(local_838[0],local_828[0] + 1);
  }
  if (local_818[0] != local_808) {
    operator_delete(local_818[0],local_808[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
    operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
  }
  if (local_970 != &local_960) {
    operator_delete(local_970,local_960 + 1);
  }
  if (local_478 != &local_468) {
    operator_delete(local_478,local_468 + 1);
  }
  if (local_498 != &local_488) {
    operator_delete(local_498,local_488 + 1);
  }
  if (local_4b8 != &local_4a8) {
    operator_delete(local_4b8,local_4a8 + 1);
  }
  if (local_910 != &local_900) {
    operator_delete(local_910,local_900 + 1);
  }
  if (local_9f0 != &local_9e0) {
    operator_delete(local_9f0,local_9e0 + 1);
  }
  if (AVar6 == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES) {
    if (local_2c8 != &local_2b8) {
      operator_delete(local_2c8,local_2b8 + 1);
    }
    if (local_2e8 != &local_2d8) {
      operator_delete(local_2e8,local_2d8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_990 != &local_980) {
    operator_delete(local_990,local_980 + 1);
  }
  if (local_4d8 != &local_4c8) {
    operator_delete(local_4d8,local_4c8 + 1);
  }
  if (local_4f8 != &local_4e8) {
    operator_delete(local_4f8,local_4e8 + 1);
  }
  if (local_518 != &local_508) {
    operator_delete(local_518,local_508 + 1);
  }
  if (local_538 != &local_528) {
    operator_delete(local_538,local_528 + 1);
  }
  if (local_558 != &local_548) {
    operator_delete(local_558,local_548 + 1);
  }
  pTVar9 = local_880;
  if (local_578 != &local_568) {
    operator_delete(local_578,local_568 + 1);
  }
  if (local_930 != &local_920) {
    operator_delete(local_930,local_920 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
    operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
  }
  if (local_a38 != &local_a28) {
    operator_delete(local_a38,(long)local_a28._vptr_RenderContext + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_598._M_dataplus._M_p != &local_598.field_2) {
    operator_delete(local_598._M_dataplus._M_p,local_598.field_2._M_allocated_capacity + 1);
  }
  if (local_9d0 != local_9c0) {
    operator_delete(local_9d0,local_9c0[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_100.transformFeedbackVaryings);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_100.attribLocationBindings);
  lVar22 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_100.sources[0].
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar22));
    lVar22 = lVar22 + -0x18;
  } while (lVar22 != -0x18);
  res.m_data._0_8_ = (**(code **)(*(long *)local_bc0 + 0x18))();
  _Stack_760._M_impl.super__Rb_tree_header._M_header._M_left =
       &_Stack_760._M_impl.super__Rb_tree_header._M_header;
  stack0xfffffffffffff890 = pTVar9;
  local_768 = CONCAT44(local_768._4_4_,local_138);
  _Stack_760._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  _Stack_760._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  _Stack_760._M_impl.super__Rb_tree_header._M_node_count = 0;
  _Stack_760._M_impl.super__Rb_tree_header._M_header._M_right =
       _Stack_760._M_impl.super__Rb_tree_header._M_header._M_left;
  glu::operator<<(pTVar9,(ShaderProgram *)&imageData);
  if (local_110 == false) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Program compilation failed");
  }
  else {
    glu::CallLogWrapper::glUseProgram(&glLog,local_138);
    glu::CallLogWrapper::glDispatchCompute(&glLog,(uint)local_c80 * 5,local_c80._4_4_,local_c04);
    lVar22 = (**(code **)(*(long *)local_bc0 + 0x18))();
    dVar14 = (**(code **)(lVar22 + 0x800))();
    glu::checkError(dVar14,"glDispatchCompute",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                    ,0x99f);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&_Stack_760);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)&imageData);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)glslVersionDeclaration._M_dataplus._M_p != &glslVersionDeclaration.field_2) {
    operator_delete(glslVersionDeclaration._M_dataplus._M_p,
                    glslVersionDeclaration.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)shaderImageTypeStr._M_dataplus._M_p != &shaderImageTypeStr.field_2) {
    operator_delete(shaderImageTypeStr._M_dataplus._M_p,
                    shaderImageTypeStr.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)shaderImageFormatStr._M_dataplus._M_p != &shaderImageFormatStr.field_2) {
    operator_delete(shaderImageFormatStr._M_dataplus._M_p,
                    shaderImageFormatStr.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)invocationCoord._M_dataplus._M_p != &invocationCoord.field_2) {
    operator_delete(invocationCoord._M_dataplus._M_p,
                    invocationCoord.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)atomicCoord._M_dataplus._M_p != &atomicCoord.field_2) {
    operator_delete(atomicCoord._M_dataplus._M_p,atomicCoord.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)colorVecTypeName._M_dataplus._M_p != &colorVecTypeName.field_2) {
    operator_delete(colorVecTypeName._M_dataplus._M_p,
                    colorVecTypeName.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)colorScalarTypeName._M_dataplus._M_p != &colorScalarTypeName.field_2) {
    operator_delete(colorScalarTypeName._M_dataplus._M_p,
                    colorScalarTypeName.field_2._M_allocated_capacity + 1);
  }
  if (local_110 == false) goto LAB_014a335d;
  AVar6 = this->m_caseType;
  dVar14 = returnValueTexture.super_ObjectWrapper.m_object;
  if ((AVar6 != ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES) &&
     (dVar14 = 0xffffffff, AVar6 == ATOMIC_OPERATION_CASE_TYPE_END_RESULT)) {
    dVar14 = endResultTexture.super_ObjectWrapper.m_object;
  }
  bufferGL = returnValueTextureBuf.super_ObjectWrapper.m_object;
  if ((AVar6 != ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES) &&
     (bufferGL = 0xffffffff, AVar6 == ATOMIC_OPERATION_CASE_TYPE_END_RESULT)) {
    bufferGL = endResultTextureBuf.super_ObjectWrapper.m_object;
  }
  imageData.m_type = (uint)(AVar6 != ATOMIC_OPERATION_CASE_TYPE_END_RESULT) * 4 + TEXTURETYPE_CUBE;
  imageData.m_size.m_data._0_8_ = &DAT_100000001;
  res.m_data[0] = 0;
  res.m_data[1] = 0;
  stack0xfffffffffffff890 = (TestLog *)((ulong)stack0xfffffffffffff890 & 0xffffffff00000000);
  lVar22 = 0;
  do {
    res.m_data[lVar22] =
         imageData.m_size.m_data[lVar22 + -1] * *(int *)((long)&local_c80 + lVar22 * 4);
    lVar22 = lVar22 + 1;
  } while (lVar22 != 3);
  if (AVar6 == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES) {
    verifyLayer = (ImageLayerVerifier *)operator_new(0x10);
    TVar15 = this->m_imageType;
    ppuVar26 = &PTR_operator___0219ea90;
LAB_014a32e8:
    verifyLayer->_vptr_ImageLayerVerifier = (_func_int **)ppuVar26;
    *(TextureType *)&verifyLayer[1]._vptr_ImageLayerVerifier = TVar15;
    *(uint *)((long)&verifyLayer[1]._vptr_ImageLayerVerifier + 4) = (uint)local_c80;
  }
  else {
    if (AVar6 == ATOMIC_OPERATION_CASE_TYPE_END_RESULT) {
      verifyLayer = (ImageLayerVerifier *)operator_new(0x10);
      TVar15 = this->m_imageType;
      ppuVar26 = &PTR_operator___0219ea50;
      goto LAB_014a32e8;
    }
    verifyLayer = (ImageLayerVerifier *)0x0;
  }
  bVar31 = readTextureAndVerify
                     ((RenderContext *)local_bc0,&glLog,dVar14,bufferGL,this->m_imageType,local_890,
                      &res,verifyLayer);
  pcVar18 = "Image verification failed";
  if (bVar31) {
    pcVar18 = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar31,pcVar18);
  (*verifyLayer->_vptr_ImageLayerVerifier[2])(verifyLayer);
LAB_014a335d:
  glu::ObjectWrapper::~ObjectWrapper(&returnValueTexture.super_ObjectWrapper);
  glu::ObjectWrapper::~ObjectWrapper(&endResultTexture.super_ObjectWrapper);
  glu::ObjectWrapper::~ObjectWrapper(&returnValueTextureBuf.super_ObjectWrapper);
  glu::ObjectWrapper::~ObjectWrapper(&endResultTextureBuf.super_ObjectWrapper);
  glu::CallLogWrapper::~CallLogWrapper(&glLog);
  return STOP;
}

Assistant:

AtomicCompSwapCase::IterateResult AtomicCompSwapCase::iterate (void)
{
	const RenderContext&		renderCtx				= m_context.getRenderContext();
	TestLog&					log						(m_testCtx.getLog());
	glu::CallLogWrapper			glLog					(renderCtx.getFunctions(), log);
	const deUint32				internalFormatGL		= glu::getInternalFormat(m_format);
	const deUint32				textureTargetGL			= getGLTextureTarget(m_imageType);
	const IVec3&				imageSize				= defaultImageSize(m_imageType);
	const int					numSlicesOrFaces		= m_imageType == TEXTURETYPE_CUBE ? 6 : imageSize.z();
	const bool					isUintFormat			= isFormatTypeUnsignedInteger(m_format.type);
	const bool					isIntFormat				= isFormatTypeSignedInteger(m_format.type);
	const glu::Buffer			endResultTextureBuf		(renderCtx);
	const glu::Buffer			returnValueTextureBuf	(renderCtx);
	const glu::Texture			endResultTexture		(renderCtx); //!< Texture for the final result; i.e. the texture on which the atomic operations are done. Size imageSize.
	const glu::Texture			returnValueTexture		(renderCtx); //!< Texture into which the return values are stored if m_caseType == CASETYPE_RETURN_VALUES.
																	 //	  Size imageSize*IVec3(N, 1, 1) or, for cube maps, imageSize*IVec3(N, N, 1) where N is NUM_INVOCATIONS_PER_PIXEL.

	DE_ASSERT(isUintFormat || isIntFormat);

	glLog.enableLogging(true);

	// Setup textures.

	log << TestLog::Message << "// Created a texture (name " << *endResultTexture << ") to act as the target of atomic operations" << TestLog::EndMessage;
	if (m_imageType == TEXTURETYPE_BUFFER)
		log << TestLog::Message << "// Created a buffer for the texture (name " << *endResultTextureBuf << ")" << TestLog::EndMessage;

	if (m_caseType == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES)
	{
		log << TestLog::Message << "// Created a texture (name " << *returnValueTexture << ") to which the intermediate return values of the atomic operation are stored" << TestLog::EndMessage;
		if (m_imageType == TEXTURETYPE_BUFFER)
			log << TestLog::Message << "// Created a buffer for the texture (name " << *returnValueTextureBuf << ")" << TestLog::EndMessage;
	}

	// Fill endResultTexture with initial pattern.

	{
		const LayeredImage imageData(m_imageType, m_format, imageSize.x(), imageSize.y(), imageSize.z());

		{
			for (int z = 0; z < numSlicesOrFaces; z++)
			for (int y = 0; y < imageSize.y(); y++)
			for (int x = 0; x < imageSize.x(); x++)
				imageData.setPixel(x, y, z, IVec4(getCompareArg(IVec3(x, y, z), imageSize.x())));
		}

		// Upload initial pattern to endResultTexture and bind to image.

		glLog.glActiveTexture(GL_TEXTURE0);
		glLog.glBindTexture(textureTargetGL, *endResultTexture);
		setTexParameteri(glLog, textureTargetGL);

		log << TestLog::Message << "// Filling end-result texture with initial pattern" << TestLog::EndMessage;

		uploadTexture(glLog, imageData, *endResultTextureBuf);
	}

	glLog.glBindImageTexture(0, *endResultTexture, 0, GL_TRUE, 0, GL_READ_WRITE, internalFormatGL);
	GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "glBindImageTexture");

	if (m_caseType == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES)
	{
		// Set storage for returnValueTexture and bind to image.

		glLog.glActiveTexture(GL_TEXTURE1);
		glLog.glBindTexture(textureTargetGL, *returnValueTexture);
		setTexParameteri(glLog, textureTargetGL);

		log << TestLog::Message << "// Setting storage of return-value texture" << TestLog::EndMessage;
		setTextureStorage(glLog, m_imageType, internalFormatGL, imageSize * (m_imageType == TEXTURETYPE_CUBE ? IVec3(NUM_INVOCATIONS_PER_PIXEL, NUM_INVOCATIONS_PER_PIXEL,	1)
																											 : IVec3(NUM_INVOCATIONS_PER_PIXEL, 1,							1)),
						  *returnValueTextureBuf);

		glLog.glBindImageTexture(1, *returnValueTexture, 0, GL_TRUE, 0, GL_WRITE_ONLY, internalFormatGL);
		GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "glBindImageTexture");
	}

	// Perform atomics in compute shader.

	{
		// Generate compute shader.

		const string colorScalarTypeName	= isUintFormat ? "uint" : isIntFormat ? "int" : DE_NULL;
		const string colorVecTypeName		= string(isUintFormat ? "u" : isIntFormat ? "i" : DE_NULL) + "vec4";
		const string atomicCoord			= m_imageType == TEXTURETYPE_BUFFER		? "gx % " + toString(imageSize.x())
											: m_imageType == TEXTURETYPE_2D			? "ivec2(gx % " + toString(imageSize.x()) + ", gy)"
											: "ivec3(gx % " + toString(imageSize.x()) + ", gy, gz)";
		const string invocationCoord		= m_imageType == TEXTURETYPE_BUFFER		? "gx"
											: m_imageType == TEXTURETYPE_2D			? "ivec2(gx, gy)"
											: "ivec3(gx, gy, gz)";
		const string shaderImageFormatStr	= getShaderImageFormatQualifier(m_format);
		const string shaderImageTypeStr		= getShaderImageType(m_format.type, m_imageType);
		const string glslVersionDeclaration	= glu::getGLSLVersionDeclaration(glu::getContextTypeGLSLVersion(renderCtx.getType()));

		const glu::ShaderProgram program(renderCtx,
			glu::ProgramSources() << glu::ComputeSource(glslVersionDeclaration + "\n"
														+ imageAtomicExtensionShaderRequires(renderCtx)
														+ textureTypeExtensionShaderRequires(m_imageType, renderCtx) +
														"\n"
														"precision highp " + shaderImageTypeStr + ";\n"
														"\n"
														"layout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n"
														"layout (" + shaderImageFormatStr + ", binding=0) coherent uniform " + shaderImageTypeStr + " u_results;\n"
														+ (m_caseType == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES ?
															  "layout (" + shaderImageFormatStr + ", binding=1) writeonly uniform " + shaderImageTypeStr + " u_returnValues;\n"
															: "") +
														"\n"
														"void main (void)\n"
														"{\n"
														"	int gx = int(gl_GlobalInvocationID.x);\n"
														"	int gy = int(gl_GlobalInvocationID.y);\n"
														"	int gz = int(gl_GlobalInvocationID.z);\n"
														"	" + colorScalarTypeName + " compare = " + colorScalarTypeName + getCompareArgShaderStr("gx", "gy", "gz", imageSize.x()) + ";\n"
														"	" + colorScalarTypeName + " data    = " + colorScalarTypeName + getAssignArgShaderStr("gx", "gy", "gz", imageSize.x()) + ";\n"
														"	" + colorScalarTypeName + " status  = " + colorScalarTypeName + "(-1);\n"
														"	status = imageAtomicCompSwap(u_results, " + atomicCoord + ", compare, data);\n"
														+ (m_caseType == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES ?
															"	imageStore(u_returnValues, " + invocationCoord + ", " + colorVecTypeName + "(status));\n" :
															"") +
														"}\n"));

		UniformAccessLogger uniforms(renderCtx.getFunctions(), log, program.getProgram());

		log << program;

		if (!program.isOk())
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Program compilation failed");
			return STOP;
		}

		// Setup and dispatch.

		glLog.glUseProgram(program.getProgram());

		glLog.glDispatchCompute(NUM_INVOCATIONS_PER_PIXEL*imageSize.x(), imageSize.y(), numSlicesOrFaces);
		GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "glDispatchCompute");
	}

	// Create reference, read texture and compare.

	{
		const deUint32								textureToCheckGL	= m_caseType == ATOMIC_OPERATION_CASE_TYPE_END_RESULT		? *endResultTexture
																		: m_caseType == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES	? *returnValueTexture
																		: (deUint32)-1;

		const deUint32								textureToCheckBufGL	= m_caseType == ATOMIC_OPERATION_CASE_TYPE_END_RESULT		? *endResultTextureBuf
																		: m_caseType == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES	? *returnValueTextureBuf
																		: (deUint32)-1;

		// The relevant region of the texture being checked (potentially
		// different from actual texture size for cube maps, because cube maps
		// may have unused pixels due to square size restriction).
		const IVec3									relevantRegion		= imageSize * (m_caseType == ATOMIC_OPERATION_CASE_TYPE_END_RESULT	? IVec3(1,							1,							1)
																					 :														  IVec3(NUM_INVOCATIONS_PER_PIXEL,	1,							1));

		const UniquePtr<const ImageLayerVerifier>	verifier			(m_caseType == ATOMIC_OPERATION_CASE_TYPE_END_RESULT		? new EndResultVerifier(m_imageType, imageSize.x())
																	   : m_caseType == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES		? new ReturnValueVerifier(m_imageType, imageSize.x())
																	   : (ImageLayerVerifier*)DE_NULL);

		if (readTextureAndVerify(renderCtx, glLog, textureToCheckGL, textureToCheckBufGL, m_imageType, m_format, relevantRegion, *verifier))
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image verification failed");

		return STOP;
	}
}